

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# baseline.cc
# Opt level: O3

base_learner * baseline_setup(options_i *options,vw *all)

{
  undefined4 uVar1;
  vw *all_00;
  options_i *options_00;
  undefined8 uVar2;
  int iVar3;
  baseline *__ptr;
  _func_int ***ppp_Var4;
  option_group_definition *poVar5;
  example *peVar6;
  base_learner *l;
  single_learner *__src;
  learner<baseline,_example> *__dest;
  bool baseline_option;
  size_type __dnew_4;
  option_group_definition new_options;
  string loss_function;
  string loss_function_type;
  size_type __dnew_3;
  size_type __dnew_2;
  size_type __dnew_1;
  bool local_6c1;
  _func_int ***local_6c0;
  _func_int **local_6b8;
  _func_int **local_6b0 [2];
  vw *local_6a0;
  options_i *local_698;
  long local_690;
  _func_int ***local_688;
  _func_int **local_680;
  _func_int **local_678 [2];
  _func_int ***local_668;
  _func_int **local_660;
  _func_int **local_658 [2];
  _func_int ***local_648;
  _func_int **local_640;
  _func_int **local_638 [2];
  string local_628;
  string local_608;
  option_group_definition local_5e8;
  long *local_5b0;
  long local_5a8;
  long local_5a0 [2];
  undefined1 *local_590;
  undefined8 local_588;
  undefined1 local_580 [16];
  string local_570;
  string local_550;
  undefined1 local_530 [112];
  bool local_4c0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_4a8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_498;
  undefined1 local_490 [112];
  bool local_420;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_408;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_3f8;
  undefined1 local_3f0 [112];
  bool local_380;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_368;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_358;
  undefined1 local_350 [136];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_2c8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_2b8;
  typed_option<bool> local_2b0;
  typed_option<bool> local_210;
  typed_option<float> local_170;
  typed_option<bool> local_d0;
  
  __ptr = calloc_or_throw<baseline>(1);
  __ptr->ec = (example *)0x0;
  __ptr->all = (vw *)0x0;
  __ptr->lr_scaling = false;
  *(undefined3 *)&__ptr->field_0x11 = 0;
  __ptr->lr_multiplier = 0.0;
  __ptr->global_only = false;
  __ptr->global_initialized = false;
  __ptr->check_enabled = false;
  *(undefined5 *)&__ptr->field_0x1b = 0;
  local_6c1 = false;
  local_590 = local_580;
  local_588 = 0;
  local_580[0] = 0;
  local_530._0_8_ = (_func_int **)0x10;
  local_6c0 = local_6b0;
  local_6c0 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_6c0,(ulong)local_530);
  local_6b0[0] = (_func_int **)local_530._0_8_;
  *(undefined4 *)local_6c0 = 0x65736142;
  builtin_strncpy((char *)((long)local_6c0 + 4),"line",4);
  *(undefined4 *)(local_6c0 + 1) = 0x74706f20;
  builtin_strncpy((char *)((long)local_6c0 + 0xc),"ions",4);
  local_6b8 = (_func_int **)local_530._0_8_;
  *(char *)((long)local_6c0 + local_530._0_8_) = '\0';
  local_5e8.m_name._M_dataplus._M_p = (pointer)&local_5e8.m_name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_5e8,local_6c0,(char *)(local_530._0_8_ + (long)local_6c0));
  local_5e8.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_5e8.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_5e8.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_6c0 != local_6b0) {
    operator_delete(local_6c0);
  }
  local_608._M_dataplus._M_p = (pointer)&local_608.field_2;
  local_608.field_2._M_allocated_capacity = 0x656e696c65736162;
  local_608._M_string_length = 8;
  local_608.field_2._M_local_buf[8] = '\0';
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_530,&local_608,&local_6c1);
  local_4c0 = true;
  local_648 = local_638;
  local_350._0_8_ = (_func_int **)0x5c;
  local_698 = options;
  ppp_Var4 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_648,(ulong)local_350);
  uVar2 = local_350._0_8_;
  local_638[0] = (_func_int **)local_350._0_8_;
  local_648 = ppp_Var4;
  memcpy(ppp_Var4,
         "Learn an additive baseline (from constant features) and a residual separately in regression."
         ,0x5c);
  local_640 = (_func_int **)uVar2;
  *(undefined1 *)((long)ppp_Var4 + uVar2) = 0;
  std::__cxx11::string::_M_assign((string *)(local_530 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_d0,(typed_option<bool> *)local_530);
  poVar5 = VW::config::option_group_definition::add<bool>(&local_5e8,&local_d0);
  local_628._M_dataplus._M_p = (pointer)&local_628.field_2;
  local_628.field_2._M_allocated_capacity._0_5_ = 0x756d5f726c;
  local_628.field_2._M_allocated_capacity._5_3_ = 0x69746c;
  local_628.field_2._8_5_ = 0x7265696c70;
  local_628._M_string_length = 0xd;
  local_628.field_2._M_local_buf[0xd] = '\0';
  VW::config::typed_option<float>::typed_option
            ((typed_option<float> *)local_350,&local_628,&__ptr->lr_multiplier);
  local_668 = local_658;
  local_3f0._0_8_ = (_func_int **)0x2b;
  local_668 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_668,(ulong)local_3f0);
  local_658[0] = (_func_int **)local_3f0._0_8_;
  builtin_strncpy((char *)((long)local_668 + 0x1b),"r baseli",8);
  builtin_strncpy((char *)((long)local_668 + 0x23),"ne model",8);
  local_668[2] = (_func_int **)0x7265696c7069746c;
  local_668[3] = (_func_int **)0x73616220726f6620;
  *local_668 = (_func_int **)0x676e696e7261656c;
  local_668[1] = (_func_int **)0x756d206574617220;
  local_660 = (_func_int **)local_3f0._0_8_;
  *(char *)((long)local_668 + local_3f0._0_8_) = '\0';
  std::__cxx11::string::_M_assign((string *)(local_350 + 0x30));
  VW::config::typed_option<float>::typed_option(&local_170,(typed_option<float> *)local_350);
  poVar5 = VW::config::option_group_definition::add<float>(poVar5,&local_170);
  local_550.field_2._M_allocated_capacity._0_7_ = 0x5f6c61626f6c67;
  local_550.field_2._7_4_ = 0x796c6e6f;
  local_550._M_string_length = 0xb;
  local_550.field_2._M_local_buf[0xb] = '\0';
  local_550._M_dataplus._M_p = (pointer)&local_550.field_2;
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_3f0,&local_550,&__ptr->global_only);
  local_380 = true;
  local_688 = local_678;
  local_490._0_8_ = (_func_int **)0x47;
  local_6a0 = all;
  ppp_Var4 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_688,(ulong)local_490);
  uVar2 = local_490._0_8_;
  local_678[0] = (_func_int **)local_490._0_8_;
  local_688 = ppp_Var4;
  memcpy(ppp_Var4,"use separate example with only global constant for baseline predictions",0x47);
  local_680 = (_func_int **)uVar2;
  *(undefined1 *)((long)ppp_Var4 + uVar2) = 0;
  std::__cxx11::string::_M_assign((string *)(local_3f0 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_210,(typed_option<bool> *)local_3f0);
  poVar5 = VW::config::option_group_definition::add<bool>(poVar5,&local_210);
  local_570.field_2._M_allocated_capacity._0_5_ = 0x6b63656863;
  local_570.field_2._M_allocated_capacity._5_3_ = 0x6e655f;
  local_570.field_2._8_5_ = 0x64656c6261;
  local_570._M_string_length = 0xd;
  local_570.field_2._M_local_buf[0xd] = '\0';
  local_570._M_dataplus._M_p = (pointer)&local_570.field_2;
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_490,&local_570,&__ptr->check_enabled);
  local_420 = true;
  local_690 = 0x38;
  local_5b0 = local_5a0;
  local_5b0 = (long *)std::__cxx11::string::_M_create((ulong *)&local_5b0,(ulong)&local_690);
  local_5a0[0] = local_690;
  local_5b0[4] = 0x61746e6f6320656c;
  local_5b0[5] = 0x62616e6520736e69;
  local_5b0[2] = 0x74206e6568772065;
  local_5b0[3] = 0x706d617865206568;
  *local_5b0 = 0x65737520796c6e6f;
  local_5b0[1] = 0x6e696c6573616220;
  local_5b0[6] = 0x67616c662064656c;
  local_5a8 = local_690;
  *(char *)((long)local_5b0 + local_690) = '\0';
  std::__cxx11::string::_M_assign((string *)(local_490 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_2b0,(typed_option<bool> *)local_490);
  VW::config::option_group_definition::add<bool>(poVar5,&local_2b0);
  local_2b0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cd0f0;
  if (local_2b0.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2b0.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_2b0.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2b0.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_2b0.super_base_option);
  if (local_5b0 != local_5a0) {
    operator_delete(local_5b0);
  }
  local_490._0_8_ = &PTR__typed_option_002cd0f0;
  if (local_3f8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3f8._M_pi);
  }
  if (local_408._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_408._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_490);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_570._M_dataplus._M_p != &local_570.field_2) {
    operator_delete(local_570._M_dataplus._M_p);
  }
  options_00 = local_698;
  local_210.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cd0f0;
  if (local_210.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_210.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_210.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_210.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_210.super_base_option);
  if (local_688 != local_678) {
    operator_delete(local_688);
  }
  local_3f0._0_8_ = &PTR__typed_option_002cd0f0;
  if (local_358._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_358._M_pi);
  }
  if (local_368._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_368._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_3f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_550._M_dataplus._M_p != &local_550.field_2) {
    operator_delete(local_550._M_dataplus._M_p);
  }
  local_170.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cd238;
  if (local_170.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170.m_default_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_170.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170.m_value.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_170.super_base_option);
  if (local_668 != local_658) {
    operator_delete(local_668);
  }
  local_350._0_8_ = &PTR__typed_option_002cd238;
  if (local_2b8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2b8._M_pi);
  }
  if (local_2c8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2c8._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_350);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_628._M_dataplus._M_p != &local_628.field_2) {
    operator_delete(local_628._M_dataplus._M_p);
  }
  local_d0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cd0f0;
  if (local_d0.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_default_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_d0.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_value.super___shared_ptr<bool,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  VW::config::base_option::~base_option(&local_d0.super_base_option);
  if (local_648 != local_638) {
    operator_delete(local_648);
  }
  all_00 = local_6a0;
  local_530._0_8_ = &PTR__typed_option_002cd0f0;
  if (local_498._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_498._M_pi);
  }
  if (local_4a8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_4a8._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_530);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_608._M_dataplus._M_p != &local_608.field_2) {
    operator_delete(local_608._M_dataplus._M_p);
  }
  (**options_00->_vptr_options_i)(options_00,&local_5e8);
  if (local_6c1 == false) {
    __dest = (learner<baseline,_example> *)0x0;
  }
  else {
    peVar6 = VW::alloc_examples(simple_label.label_size,1);
    __ptr->ec = peVar6;
    peVar6->in_use = true;
    __ptr->all = all_00;
    (**all_00->loss->_vptr_loss_function)(local_530);
    iVar3 = std::__cxx11::string::compare(local_530);
    if (iVar3 != 0) {
      __ptr->lr_scaling = true;
    }
    l = setup_base(options_00,all_00);
    __src = LEARNER::as_singleline<char,char>(l);
    uVar1 = *(undefined4 *)(__src + 0xd0);
    __dest = calloc_or_throw<LEARNER::learner<baseline,example>>(1);
    memcpy(__dest,__src,0xe9);
    *(single_learner **)(__dest + 0x20) = __src;
    *(code **)(__dest + 0x50) = LEARNER::recur_sensitivity;
    *(baseline **)(__dest + 0xb8) = __ptr;
    *(single_learner **)(__dest + 0xc0) = __src;
    *(code **)(__dest + 200) = LEARNER::noop;
    *(undefined8 *)(__dest + 0xd8) = 1;
    *(undefined8 *)(__dest + 0xe0) = *(undefined8 *)(__src + 0xe0);
    *(baseline **)(__dest + 0x18) = __ptr;
    *(code **)(__dest + 0x28) = predict_or_learn<true>;
    *(code **)(__dest + 0x38) = predict_or_learn<true>;
    *(code **)(__dest + 0x30) = predict_or_learn<false>;
    *(undefined8 *)(__dest + 0x40) = 0;
    *(undefined4 *)(__dest + 0xd0) = uVar1;
    __dest[0xe8] = (learner<baseline,_example>)0x0;
    *(baseline **)(__dest + 0x48) = __ptr;
    *(code **)(__dest + 0x50) = sensitivity;
    *(baseline **)(__dest + 0xb8) = __ptr;
    *(single_learner **)(__dest + 0xc0) = __src;
    *(code **)(__dest + 200) = finish;
    if ((undefined1 *)local_530._0_8_ != local_530 + 0x10) {
      operator_delete((void *)local_530._0_8_);
    }
    __ptr = (baseline *)0x0;
  }
  std::
  vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ::~vector(&local_5e8.m_options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5e8.m_name._M_dataplus._M_p != &local_5e8.m_name.field_2) {
    operator_delete(local_5e8.m_name._M_dataplus._M_p);
  }
  if (local_590 != local_580) {
    operator_delete(local_590);
  }
  if (__ptr != (baseline *)0x0) {
    free(__ptr);
  }
  return (base_learner *)__dest;
}

Assistant:

base_learner* baseline_setup(options_i& options, vw& all)
{
  auto data = scoped_calloc_or_throw<baseline>();
  bool baseline_option = false;
  std::string loss_function;

  option_group_definition new_options("Baseline options");
  new_options
      .add(make_option("baseline", baseline_option)
               .keep()
               .help("Learn an additive baseline (from constant features) and a residual separately in regression."))
      .add(make_option("lr_multiplier", data->lr_multiplier).help("learning rate multiplier for baseline model"))
      .add(make_option("global_only", data->global_only)
               .keep()
               .help("use separate example with only global constant for baseline predictions"))
      .add(make_option("check_enabled", data->check_enabled)
               .keep()
               .help("only use baseline when the example contains enabled flag"));
  options.add_and_parse(new_options);

  if (!baseline_option)
    return nullptr;

  // initialize baseline example
  data->ec = VW::alloc_examples(simple_label.label_size, 1);
  data->ec->in_use = true;
  data->all = &all;

  auto loss_function_type = all.loss->getType();
  if (loss_function_type != "logistic")
    data->lr_scaling = true;

  auto base = as_singleline(setup_base(options, all));

  learner<baseline, example>& l = init_learner(data, base, predict_or_learn<true>, predict_or_learn<false>);

  l.set_sensitivity(sensitivity);
  l.set_finish(finish);

  return make_base(l);
}